

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O1

void nhdp_db_neighbor_set_originator(nhdp_neighbor *neigh,netaddr *originator)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined8 uVar5;
  uint8_t uVar6;
  long lVar7;
  long *plVar8;
  list_entity *plVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  auVar10[0] = -(originator->_addr[0] == (neigh->originator)._addr[0]);
  auVar10[1] = -(originator->_addr[1] == (neigh->originator)._addr[1]);
  auVar10[2] = -(originator->_addr[2] == (neigh->originator)._addr[2]);
  auVar10[3] = -(originator->_addr[3] == (neigh->originator)._addr[3]);
  auVar10[4] = -(originator->_addr[4] == (neigh->originator)._addr[4]);
  auVar10[5] = -(originator->_addr[5] == (neigh->originator)._addr[5]);
  auVar10[6] = -(originator->_addr[6] == (neigh->originator)._addr[6]);
  auVar10[7] = -(originator->_addr[7] == (neigh->originator)._addr[7]);
  auVar10[8] = -(originator->_addr[8] == (neigh->originator)._addr[8]);
  auVar10[9] = -(originator->_addr[9] == (neigh->originator)._addr[9]);
  auVar10[10] = -(originator->_addr[10] == (neigh->originator)._addr[10]);
  auVar10[0xb] = -(originator->_addr[0xb] == (neigh->originator)._addr[0xb]);
  auVar10[0xc] = -(originator->_addr[0xc] == (neigh->originator)._addr[0xc]);
  auVar10[0xd] = -(originator->_addr[0xd] == (neigh->originator)._addr[0xd]);
  auVar10[0xe] = -(originator->_addr[0xe] == (neigh->originator)._addr[0xe]);
  auVar10[0xf] = -(originator->_addr[0xf] == (neigh->originator)._addr[0xf]);
  uVar1 = (neigh->originator)._type;
  uVar3 = (neigh->originator)._prefix_len;
  uVar2 = originator->_type;
  uVar4 = originator->_prefix_len;
  auVar11[0] = -(uVar2 == uVar1);
  auVar11[1] = -(uVar4 == uVar3);
  auVar11[2] = 0xff;
  auVar11[3] = 0xff;
  auVar11[4] = 0xff;
  auVar11[5] = 0xff;
  auVar11[6] = 0xff;
  auVar11[7] = 0xff;
  auVar11[8] = 0xff;
  auVar11[9] = 0xff;
  auVar11[10] = 0xff;
  auVar11[0xb] = 0xff;
  auVar11[0xc] = 0xff;
  auVar11[0xd] = 0xff;
  auVar11[0xe] = 0xff;
  auVar11[0xf] = 0xff;
  auVar11 = auVar11 & auVar10;
  if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) != 0xffff) {
    if ((neigh->originator)._type != '\0') {
      avl_remove(&_neigh_originator_tree,&neigh->_originator_node);
      plVar9 = (neigh->_links).next;
      if (plVar9->prev != (neigh->_links).prev) {
        do {
          avl_remove(plVar9[-0xc].next + 0x1f,plVar9 + 1);
          plVar9 = plVar9->next;
        } while (plVar9->prev != (neigh->_links).prev);
      }
    }
    lVar7 = avl_find(&_neigh_originator_tree,originator);
    if (lVar7 != 0) {
      avl_remove(&_neigh_originator_tree,lVar7);
      plVar8 = *(long **)(lVar7 + -0x70);
      if (plVar8[1] != *(long *)(lVar7 + -0x68)) {
        do {
          avl_remove(plVar8[-0x18] + 0x1f0,plVar8 + 2);
          plVar8 = (long *)*plVar8;
        } while (plVar8[1] != *(long *)(lVar7 + -0x68));
      }
      *(undefined1 (*) [16])(lVar7 + -0xa8) = (undefined1  [16])0x0;
      *(undefined2 *)(lVar7 + -0x98) = 0;
    }
    uVar6 = originator->_prefix_len;
    (neigh->originator)._type = originator->_type;
    (neigh->originator)._prefix_len = uVar6;
    uVar5 = *(undefined8 *)(originator->_addr + 8);
    *(undefined8 *)(neigh->originator)._addr = *(undefined8 *)originator->_addr;
    *(undefined8 *)((neigh->originator)._addr + 8) = uVar5;
    if (originator->_type != '\0') {
      avl_insert(&_neigh_originator_tree,&neigh->_originator_node);
      plVar9 = (neigh->_links).next;
      if (plVar9->prev != (neigh->_links).prev) {
        do {
          avl_insert(plVar9[-0xc].next + 0x1f,plVar9 + 1);
          plVar9 = plVar9->next;
        } while (plVar9->prev != (neigh->_links).prev);
      }
    }
    oonf_class_event(&_neigh_info,neigh,OONF_OBJECT_CHANGED);
    uVar6 = originator->_prefix_len;
    (neigh->_old_originator)._type = originator->_type;
    (neigh->_old_originator)._prefix_len = uVar6;
    uVar5 = *(undefined8 *)(originator->_addr + 8);
    *(undefined8 *)(neigh->_old_originator)._addr = *(undefined8 *)originator->_addr;
    *(undefined8 *)((neigh->_old_originator)._addr + 8) = uVar5;
  }
  return;
}

Assistant:

void
nhdp_db_neighbor_set_originator(struct nhdp_neighbor *neigh, const struct netaddr *originator) {
  struct nhdp_neighbor *neigh2;
  struct nhdp_link *lnk;

  if (memcmp(&neigh->originator, originator, sizeof(*originator)) == 0) {
    /* same originator, nothing to do */
    return;
  }

  if (netaddr_get_address_family(&neigh->originator) != AF_UNSPEC) {
    /* different originator, remove from tree */
    avl_remove(&_neigh_originator_tree, &neigh->_originator_node);

    list_for_each_element(&neigh->_links, lnk, _neigh_node) {
      /* remove links from interface specific tree */
      avl_remove(&lnk->local_if->_link_originators, &lnk->_originator_node);
    }
  }

  neigh2 = nhdp_db_neighbor_get_by_originator(originator);
  if (neigh2) {
    /* different neighbor has this originator, invalidate it */
    avl_remove(&_neigh_originator_tree, &neigh2->_originator_node);

    list_for_each_element(&neigh2->_links, lnk, _neigh_node) {
      /* remove links from interface specific tree */
      avl_remove(&lnk->local_if->_link_originators, &lnk->_originator_node);
    }

    netaddr_invalidate(&neigh2->originator);
  }

  /* copy originator address into neighbor */
  memcpy(&neigh->originator, originator, sizeof(*originator));

  if (netaddr_get_address_family(originator) != AF_UNSPEC) {
    /* add to tree if new originator is valid */
    avl_insert(&_neigh_originator_tree, &neigh->_originator_node);

    list_for_each_element(&neigh->_links, lnk, _neigh_node) {
      /* remove links from interface specific tree */
      avl_insert(&lnk->local_if->_link_originators, &lnk->_originator_node);
    }
  }

  /* inform everyone */
  oonf_class_event(&_neigh_info, neigh, OONF_OBJECT_CHANGED);

  /* overwrite "old originator" */
  memcpy(&neigh->_old_originator, originator, sizeof(*originator));
}